

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O2

void __thiscall
afsm::
state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>::
state_machine(state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>
              *this)

{
  _Rb_tree_header *p_Var1;
  
  orthogonal::
  regions_stack<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
  ::regions_stack((regions_stack<afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>,_afsm::test::json_parser_def,_unsigned_long>
                   *)this,this);
  (this->is_top_).super___atomic_flag_base._M_i = false;
  detail::
  orthogonal_state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
  ::current_handled_events
            (&this->handled_,
             (orthogonal_state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
              *)this);
  detail::
  orthogonal_state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
  ::current_deferrable_events
            (&this->deferred_,
             (orthogonal_state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
              *)this);
  (this->queued_events_).
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->queued_events_).
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->queued_events_).
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->queued_events_).
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->queued_events_).
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->queued_events_).
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->queued_events_).
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->queued_events_).
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->queued_events_).
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->queued_events_).
  super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ::_Deque_base(&(this->queued_events_).
                 super__Deque_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
               );
  (this->queue_size_).super___atomic_base<unsigned_long>._M_i = 0;
  (this->deferred_top_).super___atomic_flag_base._M_i = false;
  (this->deferred_events_).
  super__List_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->deferred_events_;
  (this->deferred_events_).
  super__List_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->deferred_events_;
  p_Var1 = &(this->deferred_event_ids_)._M_t._M_impl.super__Rb_tree_header;
  (this->deferred_events_).
  super__List_base<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>,_std::allocator<std::pair<std::function<afsm::actions::event_process_result_()>,_const_afsm::detail::event_base::id_type_*>_>_>
  ._M_impl._M_node._M_size = 0;
  *(undefined8 *)&(this->deferred_event_ids_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->deferred_event_ids_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->deferred_event_ids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->deferred_event_ids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->deferred_event_ids_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->deferred_event_ids_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

state_machine()
        : base_machine_type{this},
          is_top_{},
          handled_{ base_machine_type::current_handled_events() },
          deferred_{ base_machine_type::current_deferrable_events() },
          mutex_{},
          queued_events_{},
          queue_size_{0},
          deferred_top_{},
          deferred_events_{},
          deferred_event_ids_{}
      {}